

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_sinh(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  SinhLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_sinh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_sinh(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::SinhLayerParams>(arena);
    (this->layer_).sinh_ = pSVar2;
  }
  return (SinhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SinhLayerParams* NeuralNetworkLayer::_internal_mutable_sinh() {
  if (!_internal_has_sinh()) {
    clear_layer();
    set_has_sinh();
    layer_.sinh_ = CreateMaybeMessage< ::CoreML::Specification::SinhLayerParams >(GetArenaForAllocation());
  }
  return layer_.sinh_;
}